

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteBlock.h
# Opt level: O3

void __thiscall Js::ByteBlock::ByteBlock(ByteBlock *this,uint size,ArenaAllocator *alloc)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  uchar *puVar5;
  Type *addr;
  
  this->m_contentSize = size;
  (this->m_content).ptr = (uchar *)0x0;
  if (size == 0) {
    puVar5 = &DAT_00000008;
  }
  else {
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_007e9beb;
      *puVar4 = 0;
    }
    puVar5 = (uchar *)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                      AllocInternal(&alloc->
                                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                    ,(ulong)size);
    if (puVar5 == (uchar *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_007e9beb:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
      puVar5 = (uchar *)0x0;
    }
  }
  addr = &this->m_content;
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = puVar5;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  return;
}

Assistant:

ByteBlock(uint size, ArenaAllocator* alloc) : m_contentSize(size), m_content(nullptr)
        {
            m_content = AnewArray(alloc, byte, size);
        }